

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

void gb_update_noise_channel(gb_sound_t *gb,SOUND *snd,UINT32 cycles)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  bVar1 = (gb->snd_4).reg[3];
  uVar2 = *(int *)(gb_noise_period_cycles_divisor + (ulong)(bVar1 & 7) * 4) << (bVar1 >> 4);
  uVar3 = cycles + snd->cycles_left;
  snd->cycles_left = uVar3;
  if (uVar2 <= uVar3) {
    uVar6 = (uint)snd->noise_lfsr;
    do {
      uVar3 = uVar3 - uVar2;
      uVar5 = uVar6 >> 1;
      uVar6 = (uVar5 ^ uVar6) & 1;
      uVar4 = uVar6 << 0xe;
      uVar6 = uVar6 << 6 | uVar4 | uVar5 & 0xffffffbf;
      if (snd->noise_short == false) {
        uVar6 = uVar4 | uVar5;
      }
    } while (uVar2 <= uVar3);
    snd->cycles_left = uVar3;
    snd->noise_lfsr = (UINT16)uVar6;
    snd->signal = -((byte)uVar6 & 1) | 1;
  }
  return;
}

Assistant:

static void gb_update_noise_channel(gb_sound_t *gb, struct SOUND *snd, UINT32 cycles)
{
	UINT32 period = gb_noise_period_cycles(gb);
	snd->cycles_left += cycles;
	while (snd->cycles_left >= period)
	{
		UINT16 feedback;
		snd->cycles_left -= period;

		// Using a Polynomial Counter (aka Linear Feedback Shift Register)
		// Mode 4 has a 15 bit counter so we need to shift the bits around accordingly.
		feedback = ((snd->noise_lfsr >> 1) ^ snd->noise_lfsr) & 1;
		snd->noise_lfsr = (snd->noise_lfsr >> 1) | (feedback << 14);
		if (snd->noise_short)
		{
			snd->noise_lfsr = (snd->noise_lfsr & ~(1 << 6)) | (feedback << 6);
		}
		snd->signal = (snd->noise_lfsr & 1) ? -1 : 1;
	}
}